

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters.c
# Opt level: O2

void ihevc_intra_pred_luma_horz
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  uint uVar1;
  ulong uVar2;
  UWORD8 *pUVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  
  uVar1 = nt * 2;
  if (nt == 0x20) {
    for (uVar2 = 0; uVar2 != 0x20; uVar2 = uVar2 + 1) {
      for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 1) {
        pu1_dst[lVar5] = pu1_ref[~uVar2 + (ulong)uVar1];
      }
      pu1_dst = pu1_dst + dst_strd;
    }
  }
  else {
    lVar5 = (long)(int)uVar1;
    uVar2 = 0;
    uVar6 = 0;
    if (0 < nt) {
      uVar6 = (ulong)(uint)nt;
    }
    for (; uVar6 != uVar2; uVar2 = uVar2 + 1) {
      iVar4 = ((int)((uint)pu1_ref[uVar2 + lVar5 + 1] - (uint)pu1_ref[lVar5]) >> 1) +
              (uint)pu1_ref[lVar5 + -1];
      if ((short)iVar4 < 1) {
        iVar4 = 0;
      }
      if (0xfe < (short)iVar4) {
        iVar4 = 0xff;
      }
      pu1_dst[uVar2] = (UWORD8)iVar4;
    }
    pUVar3 = pu1_dst + dst_strd;
    for (lVar5 = 1; lVar5 < nt; lVar5 = lVar5 + 1) {
      for (uVar2 = 0; (uint)nt != uVar2; uVar2 = uVar2 + 1) {
        pUVar3[uVar2] = pu1_ref[(int)(~(uint)lVar5 + uVar1)];
      }
      pUVar3 = pUVar3 + dst_strd;
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_horz(UWORD8 *pu1_ref,
                                WORD32 src_strd,
                                UWORD8 *pu1_dst,
                                WORD32 dst_strd,
                                WORD32 nt,
                                WORD32 mode)
{

    WORD32 row, col;
    WORD32 two_nt;
    WORD16 s2_predpixel;
    UNUSED(mode);
    UNUSED(src_strd);
    two_nt = 2 * nt;

    if(nt == 32)
    {
        for(row = 0; row < nt; row++)
            for(col = 0; col < nt; col++)
                pu1_dst[(row * dst_strd) + col] = pu1_ref[two_nt - 1 - row];
    }
    else
    {
        /*Filtering done for the 1st row */
        for(col = 0; col < nt; col++)
        {
            s2_predpixel = pu1_ref[two_nt - 1]
                            + ((pu1_ref[two_nt + 1 + col] - pu1_ref[two_nt]) >> 1);
            pu1_dst[col] = CLIP_U8(s2_predpixel);
        }

        /* Replication to next rows*/
        for(row = 1; row < nt; row++)
            for(col = 0; col < nt; col++)
                pu1_dst[(row * dst_strd) + col] = pu1_ref[two_nt - 1 - row];
    }
}